

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastrender.h
# Opt level: O2

void __thiscall
SQCompilation::RenderVisitor::visitDoWhileStatement(RenderVisitor *this,DoWhileStatement *loop)

{
  long lVar1;
  
  OutputStream::writeString(this->_out,"DO");
  this->_indent = this->_indent + 2;
  (*(this->super_Visitor)._vptr_Visitor[0x19])(this,loop);
  lVar1 = this->_indent + -2;
  this->_indent = lVar1;
  indent(this,(int)lVar1);
  OutputStream::writeString(this->_out,"WHILE (");
  newLine(this);
  Node::visit<SQCompilation::RenderVisitor>(&loop->_cond->super_Node,this);
  OutputStream::writeChar(this->_out,')');
  return;
}

Assistant:

virtual void visitDoWhileStatement(DoWhileStatement *loop) {
        _out->writeString("DO");

        _indent += 2;
        visitLoopStatement(loop);
        _indent -= 2;

        indent(_indent);
        _out->writeString("WHILE (");
        newLine();
        loop->condition()->visit(this);
        _out->writeChar(')');
    }